

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnBrTableExpr
          (BinaryReaderIR *this,Index num_targets,Index *target_depths,Index default_target_depth)

{
  Result RVar1;
  pointer *__ptr;
  long lVar2;
  unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_> expr;
  Expr *local_a8;
  _Head_base<0UL,_wabt::Expr_*,_false> local_a0;
  Location local_98;
  Var local_78;
  
  MakeUnique<wabt::BrTableExpr>();
  local_98.field_1.field_0.line = 0;
  local_98.field_1._4_8_ = 0;
  local_98.filename.data_ = (char *)0x0;
  local_98.filename.size_._0_4_ = 0;
  local_98.filename.size_._4_4_ = 0;
  Var::Var(&local_78,default_target_depth,&local_98);
  Var::operator=((Var *)&local_a8[1].loc,&local_78);
  Var::~Var(&local_78);
  std::vector<wabt::Var,_std::allocator<wabt::Var>_>::resize
            ((vector<wabt::Var,_std::allocator<wabt::Var>_> *)(local_a8 + 1),(ulong)num_targets);
  if (num_targets != 0) {
    lVar2 = 0;
    do {
      local_98.field_1.field_0.line = 0;
      local_98.field_1._4_8_ = 0;
      local_98.filename.data_ = (char *)0x0;
      local_98.filename.size_._0_4_ = 0;
      local_98.filename.size_._4_4_ = 0;
      Var::Var(&local_78,*target_depths,&local_98);
      Var::operator=((Var *)((long)local_a8[1]._vptr_Expr + lVar2),&local_78);
      Var::~Var(&local_78);
      target_depths = target_depths + 1;
      lVar2 = lVar2 + 0x48;
    } while ((ulong)num_targets * 0x48 != lVar2);
  }
  local_a0._M_head_impl = local_a8;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_a0);
  if (local_a0._M_head_impl != (Expr *)0x0) {
    (*(local_a0._M_head_impl)->_vptr_Expr[1])();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnBrTableExpr(Index num_targets,
                                     Index* target_depths,
                                     Index default_target_depth) {
  auto expr = MakeUnique<BrTableExpr>();
  expr->default_target = Var(default_target_depth);
  expr->targets.resize(num_targets);
  for (Index i = 0; i < num_targets; ++i) {
    expr->targets[i] = Var(target_depths[i]);
  }
  return AppendExpr(std::move(expr));
}